

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LWOFileData.h
# Opt level: O2

void __thiscall Assimp::LWO::VMapEntry::~VMapEntry(VMapEntry *this)

{
  this->_vptr_VMapEntry = (_func_int **)&PTR__VMapEntry_0071ebd8;
  std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
            (&(this->abAssigned).super__Bvector_base<std::allocator<bool>_>);
  std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
            (&(this->rawData).super__Vector_base<float,_std::allocator<float>_>);
  std::__cxx11::string::~string((string *)&this->name);
  return;
}

Assistant:

virtual ~VMapEntry() {}